

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertOrReplace.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::tree::Material::insertOrReplace(Material *this,Section *section)

{
  bool bVar1;
  File *this_00;
  int local_4c;
  File local_48;
  
  bVar1 = hasMF(this,section->mf_);
  if (!bVar1) {
    local_4c = section->mf_;
    local_48.mat_ = this->mat_;
    local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_48.mf_ = local_4c;
    local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_48.sections_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::File>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::File>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::File>>>
    ::_M_emplace_unique<int,njoy::ENDFtk::tree::File>
              ((_Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::File>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::File>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::File>>>
                *)&this->files_,&local_4c,&local_48);
    std::
    _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::tree::Section>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
    ::~_Rb_tree(&local_48.sections_._M_t);
  }
  this_00 = file(this,section->mf_);
  File::insertOrReplace(this_00,section);
  return;
}

Assistant:

void insertOrReplace( Section&& section ) {

  if ( !this->hasMF( section.MF() ) ) {

    this->files_.emplace( section.MF(), File( this->MAT(), section.MF() ) );
  }

  this->MF( section.MF() ).insertOrReplace( std::move( section ) );
}